

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectTfi(Gia_Man_t *p,Vec_Int_t *vRoots,Vec_Int_t *vNodes)

{
  int iObj;
  int i;
  
  vNodes->nSize = 0;
  Gia_ManIncrementTravId(p);
  for (i = 0; i < vRoots->nSize; i = i + 1) {
    iObj = Vec_IntEntry(vRoots,i);
    Gia_ManCollectTfi_rec(p,iObj,vNodes);
  }
  return;
}

Assistant:

void Gia_ManCollectTfi( Gia_Man_t * p, Vec_Int_t * vRoots, Vec_Int_t * vNodes )
{
    int i, iRoot; 
    Vec_IntClear( vNodes );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_ManCollectTfi_rec( p, iRoot, vNodes );
}